

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.h
# Opt level: O0

string * __thiscall Integer::asString_abi_cxx11_(string *__return_storage_ptr__,Integer *this)

{
  Integer *this_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,this->value);
  return __return_storage_ptr__;
}

Assistant:

std::string asString() override {
        return std::to_string(value);
    }